

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_button_color(nk_context *ctx,nk_color color)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *in;
  nk_rect bounds;
  nk_rect content;
  nk_rect local_100;
  nk_rect local_f0;
  nk_style_button local_e0;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4a72,"int nk_button_color(struct nk_context *, struct nk_color)");
  }
  pnVar1 = ctx->current;
  if (pnVar1 != (nk_window *)0x0) {
    pnVar2 = pnVar1->layout;
    if (pnVar2 != (nk_panel *)0x0) {
      nVar3 = nk_widget(&local_100,ctx);
      if (nVar3 != NK_WIDGET_INVALID) {
        if (nVar3 == NK_WIDGET_ROM) {
          in = (nk_context *)0x0;
        }
        else {
          in = (nk_context *)0x0;
          if ((pnVar2->flags & 0x800) == 0) {
            in = ctx;
          }
        }
        memcpy(&local_e0,&(ctx->style).button,0xb0);
        local_e0.normal.type = NK_STYLE_ITEM_COLOR;
        local_e0.hover.type = NK_STYLE_ITEM_COLOR;
        local_e0.active.type = NK_STYLE_ITEM_COLOR;
        local_e0.normal.data.color = color;
        local_e0.hover.data.color = color;
        local_e0.active.data.color = color;
        nVar3 = nk_do_button(&ctx->last_widget_state,&pnVar1->buffer,local_100,&local_e0,&in->input,
                             ctx->button_behavior,&local_f0);
        nk_draw_button(&pnVar1->buffer,&local_100,ctx->last_widget_state,&local_e0);
      }
      return nVar3;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4a74,"int nk_button_color(struct nk_context *, struct nk_color)");
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x4a73,"int nk_button_color(struct nk_context *, struct nk_color)");
}

Assistant:

NK_API int
nk_button_color(struct nk_context *ctx, struct nk_color color)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;
    struct nk_style_button button;

    int ret = 0;
    struct nk_rect bounds;
    struct nk_rect content;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    button = ctx->style.button;
    button.normal = nk_style_item_color(color);
    button.hover = nk_style_item_color(color);
    button.active = nk_style_item_color(color);
    ret = nk_do_button(&ctx->last_widget_state, &win->buffer, bounds,
                &button, in, ctx->button_behavior, &content);
    nk_draw_button(&win->buffer, &bounds, ctx->last_widget_state, &button);
    return ret;
}